

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3rbu_savestate(sqlite3rbu *p)

{
  sqlite3_file *psVar1;
  int iVar2;
  int iVar3;
  char *zSql;
  
  iVar2 = p->rc;
  iVar3 = 0;
  if (iVar2 != 0x65) {
    if ((iVar2 == 0) && (p->eStage == 1)) {
      iVar2 = sqlite3_exec(p->dbMain,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
    }
    if ((iVar2 == 0) && (iVar2 = 0, p->eStage == 4)) {
      psVar1 = p->pTargetFd->pReal;
      iVar2 = (*psVar1->pMethods->xSync)(psVar1,2);
    }
    p->rc = iVar2;
    rbuSaveState(p,p->eStage);
    iVar3 = p->rc;
    if (p->eStage == 1) {
      if (iVar3 == 0) {
        iVar3 = sqlite3_exec(p->dbRbu,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
      }
      if (iVar3 == 0) {
        zSql = "BEGIN IMMEDIATE";
        if (p->zTarget == (char *)0x0) {
          zSql = "BEGIN";
        }
        iVar3 = sqlite3_exec(p->dbRbu,zSql,(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
      }
      if (iVar3 == 0) {
        iVar3 = sqlite3_exec(p->dbMain,"BEGIN IMMEDIATE",(sqlite3_callback)0x0,(void *)0x0,
                             (char **)0x0);
      }
    }
    p->rc = iVar3;
  }
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3rbu_savestate(sqlite3rbu *p){
  int rc = p->rc;
  if( rc==SQLITE_DONE ) return SQLITE_OK;

  assert( p->eStage>=RBU_STAGE_OAL && p->eStage<=RBU_STAGE_DONE );
  if( p->eStage==RBU_STAGE_OAL ){
    assert( rc!=SQLITE_DONE );
    if( rc==SQLITE_OK ) rc = sqlite3_exec(p->dbMain, "COMMIT", 0, 0, 0);
  }

  /* Sync the db file */
  if( rc==SQLITE_OK && p->eStage==RBU_STAGE_CKPT ){
    sqlite3_file *pDb = p->pTargetFd->pReal;
    rc = pDb->pMethods->xSync(pDb, SQLITE_SYNC_NORMAL);
  }

  p->rc = rc;
  rbuSaveState(p, p->eStage);
  rc = p->rc;

  if( p->eStage==RBU_STAGE_OAL ){
    assert( rc!=SQLITE_DONE );
    if( rc==SQLITE_OK ) rc = sqlite3_exec(p->dbRbu, "COMMIT", 0, 0, 0);
    if( rc==SQLITE_OK ){ 
      const char *zBegin = rbuIsVacuum(p) ? "BEGIN" : "BEGIN IMMEDIATE";
      rc = sqlite3_exec(p->dbRbu, zBegin, 0, 0, 0);
    }
    if( rc==SQLITE_OK ) rc = sqlite3_exec(p->dbMain, "BEGIN IMMEDIATE", 0, 0,0);
  }

  p->rc = rc;
  return rc;
}